

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddReorder.c
# Opt level: O2

int cuddSwapping(DdManager *table,int lower,int upper,Cudd_ReorderingType heuristic)

{
  DdHalfWord DVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  DdNode *pDVar7;
  DdNode *pDVar8;
  DdNode *pDVar9;
  ulong uVar10;
  DdHalfWord DVar11;
  DdHalfWord x;
  DdNode *pDVar12;
  int iVar13;
  int iVar14;
  DdHalfWord y;
  DdHalfWord DVar15;
  DdHalfWord y_00;
  DdHalfWord DVar16;
  ulong local_70;
  
  iVar14 = (upper - lower) + 1;
  iVar13 = 0;
  local_70 = 0xffffffff;
  do {
    if ((upper - lower < iVar13) || (table->siftMaxSwap <= ddTotalNumberSwapping)) {
      return 1;
    }
    if (heuristic == CUDD_REORDER_RANDOM_PIVOT) {
      iVar4 = -1;
      lVar5 = (long)lower * 0x38 + 0x10;
      for (uVar10 = (long)lower; (long)uVar10 <= (long)upper; uVar10 = uVar10 + 1) {
        iVar2 = *(int *)((long)&table->subtables->nodelist + lVar5);
        if (iVar4 < iVar2) {
          local_70 = uVar10;
          iVar4 = iVar2;
        }
        local_70 = local_70 & 0xffffffff;
        lVar5 = lVar5 + 0x38;
      }
      iVar4 = (int)local_70;
      DVar15 = upper;
      if (upper - iVar4 != 0) {
        uVar10 = Cudd_Random();
        DVar15 = iVar4 + (int)((long)((ulong)(uint)((int)uVar10 >> 0x1f) << 0x20 |
                                     uVar10 & 0xffffffff) % (long)(upper - iVar4)) + 1;
      }
      DVar11 = lower;
      if (0 < iVar4 + ~lower) {
        do {
          uVar10 = Cudd_Random();
          DVar11 = (DdHalfWord)
                   ((long)((ulong)(uint)((int)uVar10 >> 0x1f) << 0x20 | uVar10 & 0xffffffff) %
                   (long)(iVar4 + ~lower));
        } while (DVar11 == DVar15);
      }
    }
    else {
      uVar10 = Cudd_Random();
      do {
        uVar6 = Cudd_Random();
        iVar2 = (int)((long)((ulong)(uint)((int)uVar10 >> 0x1f) << 0x20 | uVar10 & 0xffffffff) %
                     (long)iVar14);
        iVar4 = (int)((long)((ulong)(uint)((int)uVar6 >> 0x1f) << 0x20 | uVar6 & 0xffffffff) %
                     (long)iVar14);
      } while (iVar2 == iVar4);
      DVar15 = iVar4 + lower;
      DVar11 = iVar2 + lower;
    }
    DVar1 = DVar15;
    if ((int)DVar15 < (int)DVar11) {
      DVar1 = DVar11;
    }
    if ((int)DVar11 < (int)DVar15) {
      DVar15 = DVar11;
    }
    x = DVar1 - 1;
    iVar2 = table->keys - table->isolated;
    pDVar8 = (DdNode *)0x0;
    iVar4 = iVar2;
    DVar11 = DVar15;
    y = DVar1;
    while( true ) {
      y_00 = DVar11 + 1;
      pDVar12 = pDVar8;
      DVar16 = y;
      if (y_00 == x) {
        iVar3 = cuddSwapInPlace(table,DVar11,x);
        if ((iVar3 == 0) || (pDVar7 = cuddDynamicAllocNode(table), pDVar7 == (DdNode *)0x0))
        goto LAB_00662722;
        pDVar7->index = DVar11;
        pDVar7->ref = x;
        *(int *)((long)&pDVar7->next + 4) = iVar3;
        (pDVar7->type).kids.T = pDVar8;
        iVar3 = cuddSwapInPlace(table,x,y);
        pDVar12 = pDVar7;
        if ((iVar3 == 0) || (pDVar8 = cuddDynamicAllocNode(table), pDVar8 == (DdNode *)0x0))
        goto LAB_00662722;
        pDVar8->index = x;
        pDVar8->ref = y;
        *(int *)((long)&pDVar8->next + 4) = iVar3;
        (pDVar8->type).kids.T = pDVar7;
        iVar3 = cuddSwapInPlace(table,DVar11,x);
        pDVar12 = pDVar8;
        if ((iVar3 == 0) || (pDVar7 = cuddDynamicAllocNode(table), pDVar7 == (DdNode *)0x0))
        goto LAB_00662722;
        pDVar7->index = DVar11;
        y_00 = x;
        y = DVar11;
      }
      else {
        iVar3 = cuddSwapInPlace(table,DVar11,y_00);
        if (DVar11 == x) {
          if ((iVar3 == 0) || (pDVar7 = cuddDynamicAllocNode(table), pDVar7 == (DdNode *)0x0))
          goto LAB_00662722;
          pDVar7->index = DVar11;
          y = DVar11;
        }
        else {
          if ((iVar3 == 0) || (pDVar9 = cuddDynamicAllocNode(table), pDVar9 == (DdNode *)0x0))
          goto LAB_00662722;
          pDVar9->index = DVar11;
          pDVar9->ref = y_00;
          *(int *)((long)&pDVar9->next + 4) = iVar3;
          (pDVar9->type).kids.T = pDVar8;
          iVar3 = cuddSwapInPlace(table,x,y);
          pDVar12 = pDVar9;
          if ((iVar3 == 0) || (pDVar7 = cuddDynamicAllocNode(table), pDVar7 == (DdNode *)0x0))
          goto LAB_00662722;
          pDVar7->index = x;
          pDVar8 = pDVar9;
          DVar16 = y_00;
          y_00 = y;
          y = x;
        }
      }
      pDVar7->ref = y_00;
      *(int *)((long)&pDVar7->next + 4) = iVar3;
      (pDVar7->type).kids.T = pDVar8;
      x = y - 1;
      if (((int)DVar1 <= (int)DVar16) || ((double)iVar4 * table->maxGrowth < (double)iVar3)) break;
      pDVar8 = pDVar7;
      DVar11 = DVar16;
      if (iVar3 < iVar4) {
        iVar4 = iVar3;
      }
    }
    if ((int)DVar15 < (int)y) {
      iVar4 = cuddSwapInPlace(table,x,y);
      pDVar12 = pDVar7;
      if ((iVar4 == 0) || (pDVar8 = cuddDynamicAllocNode(table), pDVar8 == (DdNode *)0x0)) {
LAB_00662722:
        pDVar7 = (DdNode *)0x0;
        while (pDVar12 != (DdNode *)0x0) {
          pDVar8 = (pDVar12->type).kids.T;
          pDVar12->ref = 0;
          pDVar12->next = table->nextFree;
          table->nextFree = pDVar12;
          pDVar12 = pDVar8;
        }
LAB_00662767:
        while (pDVar7 != (DdNode *)0x0) {
          pDVar8 = (pDVar7->type).kids.T;
          pDVar7->ref = 0;
          pDVar7->next = table->nextFree;
          table->nextFree = pDVar7;
          pDVar7 = pDVar8;
        }
        return 0;
      }
      pDVar8->index = x;
      pDVar8->ref = y;
      *(int *)((long)&pDVar8->next + 4) = iVar4;
      (pDVar8->type).kids.T = pDVar7;
      pDVar7 = pDVar8;
    }
    iVar4 = ddSiftingBackward(table,iVar2,(Move *)pDVar7);
    if (iVar4 == 0) goto LAB_00662767;
    pDVar8 = table->nextFree;
    while (pDVar7 != (DdNode *)0x0) {
      pDVar12 = (pDVar7->type).kids.T;
      pDVar7->ref = 0;
      pDVar7->next = pDVar8;
      pDVar8 = pDVar7;
      pDVar7 = pDVar12;
    }
    table->nextFree = pDVar8;
    iVar13 = iVar13 + 1;
  } while( true );
}

Assistant:

int
cuddSwapping(
  DdManager * table,
  int lower,
  int upper,
  Cudd_ReorderingType heuristic)
{
    int i, j;
    int max, keys;
    int nvars;
    int x, y;
    int iterate;
    int previousSize;
    Move *moves, *move;
    int pivot = -1;
    int modulo;
    int result;

#ifdef DD_DEBUG
    /* Sanity check */
    assert(lower >= 0 && upper < table->size && lower <= upper);
#endif

    nvars = upper - lower + 1;
    iterate = nvars;

    for (i = 0; i < iterate; i++) {
        if (ddTotalNumberSwapping >= table->siftMaxSwap)
            break;
        if (heuristic == CUDD_REORDER_RANDOM_PIVOT) {
            max = -1;
            for (j = lower; j <= upper; j++) {
                if ((keys = table->subtables[j].keys) > max) {
                    max = keys;
                    pivot = j;
                }
            }

            modulo = upper - pivot;
            if (modulo == 0) {
                y = pivot;
            } else{
                y = pivot + 1 + ((int) Cudd_Random() % modulo);
            }

            modulo = pivot - lower - 1;
            if (modulo < 1) {
                x = lower;
            } else{
                do {
                    x = (int) Cudd_Random() % modulo;
                } while (x == y);
            }
        } else {
            x = ((int) Cudd_Random() % nvars) + lower;
            do {
                y = ((int) Cudd_Random() % nvars) + lower;
            } while (x == y);
        }
        previousSize = table->keys - table->isolated;
        moves = ddSwapAny(table,x,y);
        if (moves == NULL) goto cuddSwappingOutOfMem;
        result = ddSiftingBackward(table,previousSize,moves);
        if (!result) goto cuddSwappingOutOfMem;
        while (moves != NULL) {
            move = moves->next;
            cuddDeallocMove(table, moves);
            moves = move;
        }
#ifdef DD_STATS
        if (table->keys < (unsigned) previousSize + table->isolated) {
            (void) fprintf(table->out,"-");
        } else if (table->keys > (unsigned) previousSize + table->isolated) {
            (void) fprintf(table->out,"+");     /* should never happen */
        } else {
            (void) fprintf(table->out,"=");
        }
        fflush(table->out);
#endif
#if 0
        (void) fprintf(table->out,"#:t_SWAPPING %8d: tmp size\n",
                       table->keys - table->isolated);
#endif
    }

    return(1);

cuddSwappingOutOfMem:
    while (moves != NULL) {
        move = moves->next;
        cuddDeallocMove(table, moves);
        moves = move;
    }

    return(0);

}